

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O0

NodeRange __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
::AddConstraintAndTryNoteResultVariable<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
          (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *this,AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *con)

{
  bool bVar1;
  int iVar2;
  int i_00;
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>
  *pck;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  string *this_00;
  BasicConstraint *in_RSI;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_RDI;
  NodeRange NVar3;
  ConInfo ci;
  int i;
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>
  *ck;
  int resvar;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *in_stack_ffffffffffffff68;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_ffffffffffffff70;
  int d;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  BasicConstraintKeeper *in_stack_ffffffffffffffb8;
  CStringRef in_stack_ffffffffffffffc0;
  
  iVar2 = BasicConstraint::GetResultVar(in_RSI);
  pck = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        ::GetConstraintKeeper(in_RDI,(LinConGE *)0x0);
  d = (int)((ulong)in_RDI >> 0x20);
  i_00 = ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
         ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
                   ((ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>
                     *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),d,
                    (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)
                    in_stack_ffffffffffffff70);
  ConstraintLocationHelper<mp::BasicConstraintKeeper>::ConstraintLocationHelper
            ((ConstraintLocationHelper<mp::BasicConstraintKeeper> *)&stack0xffffffffffffffb8,
             &pck->super_BasicConstraintKeeper,i_00);
  if (-1 < iVar2) {
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AddInitExpression((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                         *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),d,
                        (ConInfo *)in_stack_ffffffffffffff70);
  }
  GetConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
            (in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  bVar1 = MapInsert<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
  if (!bVar1) {
    s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        __cxa_allocate_exception(0x18);
    this_00 = ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
              ::GetDescription_abi_cxx11_
                        ((ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
                          *)pck);
    std::operator+((char *)in_stack_ffffffffffffffb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    fmt::BasicCStringRef<char>::BasicCStringRef((BasicCStringRef<char> *)this_00,s);
    Error::Error((Error *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffb4);
    __cxa_throw(s,&Error::typeinfo,Error::~Error);
  }
  NVar3 = BasicConstraintKeeper::SelectValueNodeRange
                    ((BasicConstraintKeeper *)in_stack_ffffffffffffff70,
                     (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68)
  ;
  return NVar3;
}

Assistant:

pre::NodeRange AddConstraintAndTryNoteResultVariable(Constraint&& con) {
    const auto resvar = con.GetResultVar();
    auto& ck = GET_CONSTRAINT_KEEPER( Constraint );
    auto i = ck.AddConstraint(constr_depth_, std::move(con));
    ConInfo ci{&ck, i};
    if (resvar>=0)
      AddInitExpression(resvar, ci);
    /// Can also cache non-functional constraints,
    /// but then implement checking before
    if (! MP_DISPATCH( MapInsert(
                         MPD(template GetConstraint<Constraint>(i)), i ) ))
      MP_RAISE("Trying to MapInsert() duplicated constraint: " +
                             ck.GetDescription());
    return ck.SelectValueNodeRange(i);
  }